

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qutil.cc
# Opt level: O0

void rename_delete_test(void)

{
  int iVar1;
  ostream *poVar2;
  FILE *pFVar3;
  element_type *peVar4;
  FILE *f1;
  QPDFSystemError *anon_var_0;
  size_t local_20;
  size_t size;
  shared_ptr<char> buf;
  
  std::shared_ptr<char>::shared_ptr((shared_ptr<char> *)&size);
  local_20 = 0;
  QUtil::remove_file(anon_var_dwarf_5baf);
  assert_no_file(anon_var_dwarf_5baf);
  poVar2 = std::operator<<((ostream *)&std::cout,"create file");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  pFVar3 = (FILE *)QUtil::safe_fopen(anon_var_dwarf_5baf,anon_var_dwarf_5b61 + 4);
  fprintf(pFVar3,"one");
  fclose(pFVar3);
  QUtil::read_file_into_memory(anon_var_dwarf_5baf,(shared_ptr<char> *)&size,&local_20);
  peVar4 = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2> *)&size);
  iVar1 = memcmp(peVar4,"one",3);
  if (iVar1 != 0) {
    __assert_fail("memcmp(buf.get(), \"one\", 3) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0x288,"void rename_delete_test()");
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"rename file");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  QUtil::rename_file(anon_var_dwarf_5baf,anon_var_dwarf_5bf0);
  QUtil::read_file_into_memory(anon_var_dwarf_5bf0,(shared_ptr<char> *)&size,&local_20);
  peVar4 = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2> *)&size);
  iVar1 = memcmp(peVar4,"one",3);
  if (iVar1 == 0) {
    assert_no_file(anon_var_dwarf_5baf);
    poVar2 = std::operator<<((ostream *)&std::cout,"create file");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    pFVar3 = (FILE *)QUtil::safe_fopen(anon_var_dwarf_5baf,anon_var_dwarf_5b61 + 4);
    fprintf(pFVar3,"two");
    fclose(pFVar3);
    poVar2 = std::operator<<((ostream *)&std::cout,"rename over existing");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    QUtil::rename_file(anon_var_dwarf_5baf,anon_var_dwarf_5bf0);
    QUtil::read_file_into_memory(anon_var_dwarf_5bf0,(shared_ptr<char> *)&size,&local_20);
    peVar4 = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2> *)&size);
    iVar1 = memcmp(peVar4,"two",3);
    if (iVar1 == 0) {
      assert_no_file(anon_var_dwarf_5baf);
      poVar2 = std::operator<<((ostream *)&std::cout,"delete file");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      QUtil::remove_file(anon_var_dwarf_5bf0);
      assert_no_file(anon_var_dwarf_5baf);
      assert_no_file(anon_var_dwarf_5bf0);
      std::shared_ptr<char>::~shared_ptr((shared_ptr<char> *)&size);
      return;
    }
    __assert_fail("memcmp(buf.get(), \"two\", 3) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0x298,"void rename_delete_test()");
  }
  __assert_fail("memcmp(buf.get(), \"one\", 3) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                ,0x28d,"void rename_delete_test()");
}

Assistant:

void
rename_delete_test()
{
    std::shared_ptr<char> buf;
    size_t size = 0;

    try {
        QUtil::remove_file("old\xcf\x80");
    } catch (QPDFSystemError&) {
    }
    assert_no_file("old\xcf\x80");
    std::cout << "create file" << std::endl;
    ;
    FILE* f1 = QUtil::safe_fopen("old\xcf\x80", "w");
    fprintf(f1, "one");
    fclose(f1);
    QUtil::read_file_into_memory("old\xcf\x80", buf, size);
    assert(memcmp(buf.get(), "one", 3) == 0);
    std::cout << "rename file" << std::endl;
    ;
    QUtil::rename_file("old\xcf\x80", "old\xcf\x80.~tmp");
    QUtil::read_file_into_memory("old\xcf\x80.~tmp", buf, size);
    assert(memcmp(buf.get(), "one", 3) == 0);
    assert_no_file("old\xcf\x80");
    std::cout << "create file" << std::endl;
    ;
    f1 = QUtil::safe_fopen("old\xcf\x80", "w");
    fprintf(f1, "two");
    fclose(f1);
    std::cout << "rename over existing" << std::endl;
    ;
    QUtil::rename_file("old\xcf\x80", "old\xcf\x80.~tmp");
    QUtil::read_file_into_memory("old\xcf\x80.~tmp", buf, size);
    assert(memcmp(buf.get(), "two", 3) == 0);
    assert_no_file("old\xcf\x80");
    std::cout << "delete file" << std::endl;
    ;
    QUtil::remove_file("old\xcf\x80.~tmp");
    assert_no_file("old\xcf\x80");
    assert_no_file("old\xcf\x80.~tmp");
}